

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14b954f::DynamicWindowTitler::update_window_title(DynamicWindowTitler *this)

{
  SDL_Window *pSVar1;
  pointer pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pSVar1 = this->window_;
  if (this->mouse_is_captured_ == false) {
    local_38[0] = local_28;
    pcVar2 = (this->file_name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar2,pcVar2 + (this->file_name_)._M_string_length);
  }
  else {
    local_38[0] = local_28;
    pcVar2 = (this->file_name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar2,pcVar2 + (this->file_name_)._M_string_length);
    std::__cxx11::string::append((char *)local_38);
  }
  SDL_SetWindowTitle(pSVar1,local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void update_window_title() {
			SDL_SetWindowTitle(window_, window_title().c_str());
		}